

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

void Gia_ManDualMux(Gia_Man_t *p,int *LitC,int *LitT,int *LitE,int *LitZ)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = Abc_LitNot(*LitT);
  iVar1 = Gia_ManHashXor(p,iVar1,*LitE);
  iVar2 = Abc_LitNot(LitT[1]);
  iVar3 = Abc_LitNot(LitE[1]);
  iVar2 = Gia_ManHashAnd(p,iVar2,iVar3);
  iVar1 = Gia_ManHashAnd(p,iVar2,iVar1);
  iVar1 = Abc_LitNot(iVar1);
  iVar2 = Gia_ManHashMux(p,*LitC,LitT[1],LitE[1]);
  iVar3 = Gia_ManHashMux(p,*LitC,*LitT,*LitE);
  *LitZ = iVar3;
  iVar1 = Gia_ManHashMux(p,LitC[1],iVar1,iVar2);
  LitZ[1] = iVar1;
  return;
}

Assistant:

void Gia_ManDualMux( Gia_Man_t * p, int LitC[2], int LitT[2], int LitE[2], int LitZ[2] )
{
/*
    // total logic size: 18 nodes
    int Xnor = Gia_ManHashXor( p, Abc_LitNot(LitT[0]), LitE[0] );
    int Cond = Gia_ManHashAnd( p, Abc_LitNot(LitT[1]), Abc_LitNot(LitE[1]) );
    int pTempE[2], pTempT[2];
    pTempE[0] = Gia_ManHashMux( p, LitC[0], LitT[0], LitE[0] );
    pTempE[1] = Gia_ManHashMux( p, LitC[0], LitT[1], LitE[1] );
    //pTempT[0] = LitT[0];
    pTempT[0] = Gia_ManHashAnd( p, LitT[0], LitE[0] );
    pTempT[1] = Gia_ManHashAnd( p, Cond, Xnor );
    LitZ[0] = Gia_ManHashMux( p, LitC[1], pTempT[0], pTempE[0] );
    LitZ[1] = Gia_ManHashMux( p, LitC[1], pTempT[1], pTempE[1] );
*/
    // total logic size: 14 nodes
    int Xnor = Gia_ManHashXor( p, Abc_LitNot(LitT[0]), LitE[0] );
    int Cond = Gia_ManHashAnd( p, Abc_LitNot(LitT[1]), Abc_LitNot(LitE[1]) );
    int XVal1 = Abc_LitNot( Gia_ManHashAnd( p, Cond, Xnor ) );
    int XVal0 = Gia_ManHashMux( p, LitC[0], LitT[1], LitE[1] );
    LitZ[0] = Gia_ManHashMux( p, LitC[0], LitT[0], LitE[0] );
    LitZ[1] = Gia_ManHashMux( p, LitC[1], XVal1, XVal0 );

    if ( fForceZero ) LitZ[0]   = Gia_ManHashAnd( p, LitZ[0], Abc_LitNot(LitZ[1]) );
}